

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_format.c
# Opt level: O0

size_t cvt_s(int code,void *value,zt_fmt_put_f put,void *cl,uchar *flags,ssize_t width,
            ssize_t precision)

{
  uchar *flags_00;
  size_t sVar1;
  char *in_RCX;
  undefined8 *in_RSI;
  size_t in_R8;
  zt_fmt_put_f in_R9;
  ssize_t i;
  char *str;
  size_t lstr;
  zt_fmt_put_f in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc8;
  zt_fmt_put_f put_00;
  
  flags_00 = (uchar *)*in_RSI;
  put_00 = in_R9;
  if ((*(char *)(in_R8 + 0x23) != '\0') && (in_R9 != (zt_fmt_put_f)&DAT_ffffffff80000000)) {
    if ((long)in_R9 < 0) {
      in_R9 = (zt_fmt_put_f)-(long)in_R9;
    }
    in_stack_ffffffffffffffc8 = (void *)strlen((char *)flags_00);
    if ((long)in_R9 < (long)(int)in_stack_ffffffffffffffc8) {
      flags_00 = flags_00 + (long)in_R9;
    }
    put_00 = (zt_fmt_put_f)&DAT_ffffffff80000000;
    in_stack_ffffffffffffffb8 = in_R9;
  }
  strlen((char *)flags_00);
  sVar1 = zt_fmt_puts(in_RCX,in_R8,put_00,in_stack_ffffffffffffffc8,flags_00,
                      (ssize_t)in_stack_ffffffffffffffb8,(ssize_t)in_RSI);
  return sVar1;
}

Assistant:

static size_t
cvt_s(int code UNUSED, void * value,
      zt_fmt_put_f put, void * cl,
      unsigned char flags[],
      ssize_t width, ssize_t precision)
{
    size_t lstr;
    char * str = *(char **) value;

    zt_assert(str != NULL);

    if (flags['#']) {
        if (width != INT_MIN) {
            ssize_t   i = width;
            if (i < 0) {
                i = -i;
            }

            lstr = strlen(str);
            zt_assert(lstr < INT_MAX);
            if (i < (int)lstr) {
                str = str + i;
            }
            width = INT_MIN;
        }
    }

    return zt_fmt_puts(str, strlen(str), put, cl, flags, width, precision);
}